

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

LocalVariableDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LocalVariableDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataTypeSyntax *args_2,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3,Token *args_4)

{
  Token var;
  Token semi;
  LocalVariableDeclarationSyntax *this_00;
  
  this_00 = (LocalVariableDeclarationSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((LocalVariableDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (LocalVariableDeclarationSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  var.kind = args_1->kind;
  var._2_1_ = args_1->field_0x2;
  var.numFlags.raw = (args_1->numFlags).raw;
  var.rawLen = args_1->rawLen;
  var.info = args_1->info;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  slang::syntax::LocalVariableDeclarationSyntax::LocalVariableDeclarationSyntax
            (this_00,args,var,args_2,args_3,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }